

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCFuncPtr NULLC::FunctionRedirect(NULLCRef r,NULLCArray *arr)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  NULLCFuncPtr NVar8;
  
  if (arr == (NULLCArray *)0x0) {
    pcVar2 = "ERROR: null pointer access";
LAB_002010e8:
    nullcThrowError(pcVar2);
  }
  else {
    uVar1 = arr->len;
    if (uVar1 <= r.typeID) {
      pcVar2 = "ERROR: type index is out of bounds of redirection table";
      goto LAB_002010e8;
    }
    pcVar2 = arr->ptr;
    uVar6 = *(uint *)(pcVar2 + (ulong)r.typeID * 4);
    if (uVar6 != 0) goto LAB_002010f3;
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      if (*(int *)(pcVar2 + uVar7 * 4) != 0) {
        if (uVar1 != (uint)uVar7) {
          pcVar3 = nullcGetTypeName(r.typeID);
          pcVar4 = nullcGetTypeName(r.typeID);
          pcVar5 = nullcGetFunctionName(*(uint *)(pcVar2 + uVar7 * 4));
          pcVar5 = strchr(pcVar5,0x3a);
          uVar1 = nullcGetFunctionType(*(uint *)(pcVar2 + uVar7 * 4));
          pcVar2 = nullcGetTypeName(uVar1);
          nullcThrowError("ERROR: type \'%s\' doesn\'t implement method \'%s%s\' of type \'%s\'",
                          pcVar3,pcVar4,pcVar5,pcVar2);
          goto LAB_002010f1;
        }
        break;
      }
    }
    pcVar2 = nullcGetTypeName(r.typeID);
    nullcThrowError("ERROR: type \'%s\' doesn\'t implement method",pcVar2);
  }
LAB_002010f1:
  uVar6 = 0;
  r.ptr = (char *)0x0;
LAB_002010f3:
  NVar8.id = uVar6;
  NVar8.context = r.ptr;
  return NVar8;
}

Assistant:

NULLCFuncPtr NULLC::FunctionRedirect(NULLCRef r, NULLCArray* arr)
{
	NULLCFuncPtr ret = { 0, 0 };

	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return ret;
	}

	unsigned int *funcs = (unsigned int*)arr->ptr;
	if(r.typeID >= arr->len)
	{
		nullcThrowError("ERROR: type index is out of bounds of redirection table");
		return ret;
	}

	// If there is no implementation for a method
	if(!funcs[r.typeID])
	{
		// Find implemented function ID as a type reference
		unsigned int found = 0;
		for(; found < arr->len; found++)
		{
			if(funcs[found])
				break;
		}

		if(found == arr->len)
			nullcThrowError("ERROR: type '%s' doesn't implement method", nullcGetTypeName(r.typeID));
		else
			nullcThrowError("ERROR: type '%s' doesn't implement method '%s%s' of type '%s'", nullcGetTypeName(r.typeID), nullcGetTypeName(r.typeID), strchr(nullcGetFunctionName(funcs[found]), ':'), nullcGetTypeName(nullcGetFunctionType(funcs[found])));
		return ret;
	}

	ret.context = r.ptr;
	ret.id = funcs[r.typeID];

	return ret;
}